

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.hpp
# Opt level: O3

void __thiscall cs::function::function(function *this,function *param_1)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  bool bVar2;
  
  (this->mContext).super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (param_1->mContext).super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var1 = (param_1->mContext).super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->mContext).super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  this->mIsLambda = param_1->mIsLambda;
  bVar2 = param_1->mIsVargs;
  this->mIsMemFn = param_1->mIsMemFn;
  this->mIsVargs = bVar2;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->mArgs,&param_1->mArgs);
  std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::deque
            (&this->mBody,&param_1->mBody);
  this->call_ptr = param_1->call_ptr;
  return;
}

Assistant:

function(const function &) = default;